

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

int __thiscall
Centaurus::CATNMachine<unsigned_char>::import_regular_terminal
          (CATNMachine<unsigned_char> *this,NFA<unsigned_char> *nfa,int origin,int tag)

{
  pointer pCVar1;
  pointer pCVar2;
  int i;
  long lVar3;
  long lVar4;
  int offset;
  CharClass<unsigned_char> local_50;
  
  pCVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = (this->m_nodes).
           super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50._vptr_CharClass = (_func_int **)&PTR__CharClass_001b26c0;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  add_node(this,&local_50,origin,tag);
  CharClass<unsigned_char>::~CharClass(&local_50);
  offset = (int)(((long)pCVar1 - (long)pCVar2) / 0x50);
  CATNNode<unsigned_char>::import_transitions
            ((this->m_nodes).
             super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1,
             (nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,offset);
  lVar4 = 0x28;
  for (lVar3 = 1;
      lVar3 < (int)(((long)(nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).
                           m_states.
                           super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).
                          m_states.
                          super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x28); lVar3 = lVar3 + 1) {
    std::
    vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
    ::emplace_back<>(&this->m_nodes);
    CATNNode<unsigned_char>::import_transitions
              ((this->m_nodes).
               super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,
               (NFAState<unsigned_char> *)
               ((long)&((nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
                        super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_vptr_NFABaseState + lVar4),
               offset);
    lVar4 = lVar4 + 0x28;
  }
  return (int)(((long)(this->m_nodes).
                      super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_nodes).
                     super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x50) + -1;
}

Assistant:

int import_regular_terminal(const NFA<TCHAR>& nfa, int origin, int tag)
    {
        int offset = m_nodes.size();
        add_node(CharClass<TCHAR>(), origin, tag);
        m_nodes.back().import_transitions(nfa.get_state(0), offset);
        for (int i = 1; i < nfa.get_state_num(); i++)
        {
            m_nodes.emplace_back();
            m_nodes.back().import_transitions(nfa.get_state(i), offset);
        }
        return m_nodes.size() - 1;
    }